

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

void Abc_TtVerifySmallTruth(word *pTruth,int nVars)

{
  word wVar1;
  word nTruth;
  word local_18;
  
  if (nVars < 6) {
    wVar1 = *pTruth;
    local_18 = wVar1;
    Abc_TtNormalizeSmallTruth(&local_18,nVars);
    if (wVar1 != local_18) {
      __assert_fail("*pTruth == nTruth",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                    ,0x137,"void Abc_TtVerifySmallTruth(word *, int)");
    }
  }
  return;
}

Assistant:

static inline void Abc_TtVerifySmallTruth(word * pTruth, int nVars)
{
#ifndef NDEBUG
    if (nVars < 6) {
        word nTruth = *pTruth;
        Abc_TtNormalizeSmallTruth(&nTruth, nVars);
        assert(*pTruth == nTruth);
    }
#endif
}